

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1223:7)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1223:7)>
             *this)

{
  LookupParams *params;
  String *params_1;
  ushort uVar1;
  sa_family_t sVar2;
  CrossThreadPromiseFulfiller<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *pCVar3;
  bool bVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  int *piVar7;
  _Link_type __x;
  size_t sVar8;
  SocketAddress *extraout_RDX;
  SocketAddress *extraout_RDX_00;
  SocketAddress *extraout_RDX_01;
  SocketAddress *extraout_RDX_02;
  SocketAddress *pSVar9;
  addrinfo *paVar10;
  _Base_ptr p_Var11;
  char *__service;
  char *__name;
  _Link_type __dest;
  Exception *exception;
  _Rb_tree_node_base *p_Var12;
  undefined1 auVar13 [16];
  Fault f;
  addrinfo *list;
  set<kj::(anonymous_namespace)::SocketAddress,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
  result;
  char *local_530;
  addrinfo local_528;
  SocketAddress addr;
  Array<kj::(anonymous_namespace)::SocketAddress> result_1;
  NullableValue<kj::Exception> _exception1302;
  
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result._M_t._M_impl.super__Rb_tree_header._M_header;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params = &(this->f).params;
  local_528.ai_socktype = 0;
  local_528.ai_protocol = 0;
  local_528.ai_canonname = (char *)0x0;
  local_528.ai_next = (addrinfo *)0x0;
  local_528.ai_addrlen = 0;
  local_528._20_4_ = 0;
  local_528.ai_addr = (sockaddr *)0x0;
  local_528.ai_flags = 0x28;
  local_528.ai_family = 0;
  sVar8 = (this->f).params.host.content.size_;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((sVar8 == 2) && (iVar5 = bcmp((params->host).content.ptr,"*",2), iVar5 == 0)) {
    __name = (char *)0x0;
  }
  else if (sVar8 == 0) {
    __name = "";
  }
  else {
    __name = (params->host).content.ptr;
  }
  if ((this->f).params.service.content.size_ < 2) {
    __service = (char *)0x0;
  }
  else {
    __service = (this->f).params.service.content.ptr;
  }
  iVar5 = getaddrinfo(__name,__service,&local_528,(addrinfo **)&list);
  params_1 = &(this->f).params.service;
  if (iVar5 == -0xb) {
    piVar7 = __errno_location();
    kj::_::Debug::Fault::Fault<int,kj::String&,kj::String&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x50d,*piVar7,"getaddrinfo","params.host, params.service",&params->host,params_1);
    kj::_::Debug::Fault::~Fault(&f);
  }
  else if (iVar5 == 0) {
    if (list != (addrinfo *)0x0) {
      paVar10 = list;
      do {
        if (((this->f).params.service.content.size_ < 2) &&
           ((paVar10->ai_addr->sa_family | 8) == 10)) {
          uVar1 = (ushort)(this->f).portHint;
          *(ushort *)paVar10->ai_addr->sa_data = uVar1 << 8 | uVar1 >> 8;
        }
        memset(&addr,0,0x88);
        if (((this->f).params.host.content.size_ == 2) &&
           (iVar5 = bcmp((params->host).content.ptr,"*",2), iVar5 == 0)) {
          addr.wildcard = true;
          addr.addrlen = 0x1c;
          addr.addr.generic.sa_family = 10;
          sVar2 = paVar10->ai_addr->sa_family;
          pSVar9 = extraout_RDX;
          if ((sVar2 == 2) || (sVar2 == 10)) {
            addr.addr.inet4.sin_port = *(undefined2 *)paVar10->ai_addr->sa_data;
          }
          else {
            addr.addr.inet4.sin_port = (in_port_t)(this->f).portHint;
          }
        }
        else {
          addr.addrlen = paVar10->ai_addrlen;
          memcpy(&addr.addr,paVar10->ai_addr,(ulong)addr.addrlen);
          pSVar9 = extraout_RDX_00;
        }
        p_Var11 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          bVar4 = true;
          p_Var12 = &result._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var11 = (_Base_ptr)0x0;
        }
        else {
          do {
            p_Var12 = p_Var11;
            bVar4 = std::less<kj::(anonymous_namespace)::SocketAddress>::operator()
                              ((less<kj::(anonymous_namespace)::SocketAddress> *)&addr,
                               (SocketAddress *)(p_Var12 + 1),pSVar9);
            p_Var11 = (&p_Var12->_M_left)[!bVar4];
            pSVar9 = extraout_RDX_01;
          } while (p_Var11 != (_Base_ptr)0x0);
        }
        auVar13._8_8_ = pSVar9;
        auVar13._0_8_ = p_Var12;
        if (bVar4 == false) {
LAB_004492e8:
          bVar4 = std::less<kj::(anonymous_namespace)::SocketAddress>::operator()
                            ((less<kj::(anonymous_namespace)::SocketAddress> *)(auVar13._0_8_ + 1),
                             &addr,auVar13._8_8_);
          pSVar9 = extraout_RDX_02;
          if (!bVar4) {
            p_Var12 = (_Rb_tree_node_base *)0x0;
            p_Var11 = auVar13._0_8_;
          }
        }
        else if (p_Var12 != result._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
          auVar13 = std::_Rb_tree_decrement(p_Var12);
          goto LAB_004492e8;
        }
        if (p_Var12 != (_Rb_tree_node_base *)0x0) {
          bVar4 = true;
          if ((p_Var11 == (_Base_ptr)0x0) &&
             (&result._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var12)) {
            bVar4 = std::less<kj::(anonymous_namespace)::SocketAddress>::operator()
                              ((less<kj::(anonymous_namespace)::SocketAddress> *)&addr,
                               (SocketAddress *)(p_Var12 + 1),pSVar9);
          }
          p_Var6 = (_Rb_tree_node_base *)operator_new(0xa8);
          memcpy(p_Var6 + 1,&addr,0x88);
          std::_Rb_tree_insert_and_rebalance
                    (bVar4,p_Var6,p_Var12,&result._M_t._M_impl.super__Rb_tree_header._M_header);
          result._M_t._M_impl.super__Rb_tree_header._M_node_count =
               result._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        }
        paVar10 = paVar10->ai_next;
      } while (paVar10 != (addrinfo *)0x0);
    }
    freeaddrinfo((addrinfo *)list);
  }
  else {
    local_530 = gai_strerror(iVar5);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,char_const(&)[19],kj::String&,kj::String&,char_const*>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x512,FAILED,(char *)0x0,
               "\"DNS lookup failed.\", params.host, params.service, gai_strerror(status)",
               (char (*) [19])"DNS lookup failed.",&params->host,params_1,&local_530);
    kj::_::Debug::Fault::~Fault(&f);
  }
  _exception1302.isSet = false;
  pCVar3 = (this->f).fulfiller.ptr;
  __x = (_Link_type)
        kj::_::HeapArrayDisposer::allocateImpl
                  (0x88,0,result._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  __dest = __x;
  for (p_Var12 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &result._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    memmove(__dest,p_Var12 + 1,0x88);
    __dest = (_Link_type)((__dest->_M_storage)._M_storage + 0x68);
  }
  sVar8 = ((long)__dest - (long)__x >> 3) * -0xf0f0f0f0f0f0f0f;
  (*(pCVar3->super_PromiseFulfiller<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>).
    super_PromiseRejector._vptr_PromiseRejector[2])(pCVar3);
  if (__x != (_Link_type)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__x,0x88,sVar8,sVar8,
               (_func_void_void_ptr *)0x0);
  }
  if (_exception1302.isSet == true) {
    Exception::~Exception(&_exception1302.field_1.value);
  }
  std::
  _Rb_tree<kj::(anonymous_namespace)::SocketAddress,_kj::(anonymous_namespace)::SocketAddress,_std::_Identity<kj::(anonymous_namespace)::SocketAddress>,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
  ::_M_erase((_Rb_tree<kj::(anonymous_namespace)::SocketAddress,_kj::(anonymous_namespace)::SocketAddress,_std::_Identity<kj::(anonymous_namespace)::SocketAddress>,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
              *)result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }